

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseSession.cpp
# Opt level: O0

void __thiscall
tonk::ApplicationSession::onP2PStartConnect
          (ApplicationSession *this,uint16_t myRendezvousVisibleSourcePort,
          uint32_t rendezvousServerConnectionId,P2PConnectParams *startParams)

{
  bool bVar1;
  long lVar2;
  OutputWorker *this_00;
  LogStringBuffer *pLVar3;
  byte *in_RCX;
  char *pcVar4;
  long in_RDI;
  undefined1 uVar5;
  Result result;
  Connection *connection;
  IConnection *icon;
  LogStringBuffer buffer;
  LogStringBuffer buffer_1;
  LogStringBuffer buffer_2;
  LogStringBuffer buffer_3;
  basic_endpoint<asio::ip::udp> *in_stack_ffffffffffffed58;
  undefined7 in_stack_ffffffffffffed60;
  undefined1 in_stack_ffffffffffffed67;
  address *in_stack_ffffffffffffed68;
  undefined8 in_stack_ffffffffffffed90;
  key_t key;
  LogStringBuffer *in_stack_ffffffffffffed98;
  LogStringBuffer *buffer_00;
  OutputWorker *in_stack_ffffffffffffeda0;
  uint64_t in_stack_ffffffffffffedb8;
  P2PConnectParams *in_stack_ffffffffffffef40;
  ApplicationSession *in_stack_ffffffffffffef48;
  long local_10b0;
  undefined1 local_10a1;
  OutputWorker *local_10a0;
  OutputWorker *local_1098;
  string local_1090 [54];
  unsigned_short local_105a [17];
  string local_1038 [32];
  IConnection *local_1018;
  byte *local_1010;
  ushort local_1002 [5];
  long *local_ff8;
  long local_ff0;
  char *local_fe8;
  long local_fe0;
  byte *local_fd8;
  undefined4 local_fcc;
  byte *local_fc8;
  undefined4 local_fbc;
  char *local_fb8;
  long local_fb0;
  RefCounter *local_fa8;
  ushort *local_fa0;
  char *local_f98;
  string *local_f90;
  char *local_f88;
  ushort *local_f80;
  char *local_f78;
  byte *local_f70;
  char *local_f68;
  ushort *local_f60;
  char *local_f58;
  string *local_f50;
  char *local_f48;
  long local_f40;
  char *local_f38;
  LogStringBuffer *local_f30;
  char *local_f28;
  undefined4 in_stack_fffffffffffff0e0;
  undefined4 in_stack_fffffffffffff0e4;
  undefined8 in_stack_fffffffffffff0e8;
  uint32_t rendezvousServerConnectionId_00;
  undefined4 in_stack_fffffffffffff0f0;
  undefined4 in_stack_fffffffffffff0f4;
  Dependencies *in_stack_fffffffffffff0f8;
  Connection *in_stack_fffffffffffff100;
  undefined1 local_ef0 [16];
  ostream aoStack_ee0 [376];
  char *local_d68;
  undefined4 local_d5c;
  long local_d58;
  char *local_d50;
  string *local_d48;
  undefined1 *local_d40;
  long local_d38;
  string *local_d30;
  undefined1 *local_d28;
  long local_d20;
  string *local_d18;
  undefined1 *local_d10;
  char *local_d08;
  undefined1 *local_d00;
  long local_cf8;
  char *local_cf0;
  undefined1 *local_ce8;
  char *local_ce0;
  undefined4 local_cd4;
  long local_cd0;
  undefined4 local_cc4;
  long local_cc0;
  undefined1 local_ca8 [16];
  ostream aoStack_c98 [376];
  char *local_b20;
  undefined4 local_b14;
  long local_b10;
  char *local_b08;
  string *local_b00;
  undefined1 *local_af8;
  long local_af0;
  string *local_ae8;
  undefined1 *local_ae0;
  long local_ad8;
  string *local_ad0;
  undefined1 *local_ac8;
  char *local_ac0;
  undefined1 *local_ab8;
  long local_ab0;
  char *local_aa8;
  undefined1 *local_aa0;
  ushort *local_a98;
  char *local_a90;
  string *local_a88;
  char *local_a80;
  ushort *local_a78;
  char *local_a70;
  byte *local_a68;
  char *local_a60;
  ushort *local_a58;
  char *local_a50;
  string *local_a48;
  char *local_a40;
  undefined4 local_a34;
  long local_a30;
  undefined4 local_a24;
  long local_a20;
  undefined1 local_a08 [16];
  ostream aoStack_9f8 [376];
  ushort *local_880;
  char *local_878;
  string *local_870;
  char *local_868;
  ushort *local_860;
  char *local_858;
  byte *local_850;
  char *local_848;
  ushort *local_840;
  char *local_838;
  string *local_830;
  char *local_828;
  undefined4 local_81c;
  long local_818;
  ushort *local_810;
  char *local_808;
  string *local_800;
  char *local_7f8;
  ushort *local_7f0;
  char *local_7e8;
  byte *local_7e0;
  char *local_7d8;
  ushort *local_7d0;
  char *local_7c8;
  string *local_7c0;
  char *local_7b8;
  string *local_7b0;
  undefined1 *local_7a8;
  long local_7a0;
  string *local_798;
  undefined1 *local_790;
  long local_788;
  string *local_780;
  undefined1 *local_778;
  ushort *local_770;
  char *local_768;
  string *local_760;
  char *local_758;
  ushort *local_750;
  char *local_748;
  byte *local_740;
  char *local_738;
  ushort *local_730;
  char *local_728;
  string *local_720;
  char *local_718;
  undefined1 *local_710;
  long local_708;
  char *local_700;
  undefined1 *local_6f8;
  long local_6f0;
  ushort *local_6e8;
  char *local_6e0;
  string *local_6d8;
  char *local_6d0;
  ushort *local_6c8;
  char *local_6c0;
  byte *local_6b8;
  char *local_6b0;
  ushort *local_6a8;
  char *local_6a0;
  string *local_698;
  undefined1 *local_690;
  long local_688;
  string *local_680;
  undefined1 *local_678;
  long local_670;
  string *local_668;
  undefined1 *local_660;
  char *local_658;
  undefined1 *local_650;
  ushort *local_648;
  char *local_640;
  string *local_638;
  char *local_630;
  ushort *local_628;
  char *local_620;
  byte *local_618;
  char *local_610;
  ushort *local_608;
  char *local_600;
  undefined1 *local_5f8;
  long local_5f0;
  char *local_5e8;
  undefined1 *local_5e0;
  long local_5d8;
  ushort *local_5d0;
  char *local_5c8;
  string *local_5c0;
  char *local_5b8;
  ushort *local_5b0;
  char *local_5a8;
  byte *local_5a0;
  char *local_598;
  ushort *local_590;
  undefined1 *local_588;
  long local_580;
  ushort *local_578;
  undefined1 *local_570;
  long local_568;
  ushort *local_560;
  undefined1 *local_558;
  char *local_550;
  undefined1 *local_548;
  ushort *local_540;
  char *local_538;
  string *local_530;
  char *local_528;
  ushort *local_520;
  char *local_518;
  byte *local_510;
  char *local_508;
  undefined1 *local_500;
  long local_4f8;
  char *local_4f0;
  undefined1 *local_4e8;
  long local_4e0;
  ushort *local_4d8;
  char *local_4d0;
  string *local_4c8;
  char *local_4c0;
  ushort *local_4b8;
  char *local_4b0;
  byte *local_4a8;
  undefined1 *local_4a0;
  long local_498;
  char *local_490;
  undefined1 *local_488;
  byte *local_480;
  undefined1 *local_478;
  long local_470;
  ushort *local_468;
  char *local_460;
  string *local_458;
  char *local_450;
  ushort *local_448;
  char *local_440;
  undefined1 *local_438;
  long local_430;
  byte *local_428;
  undefined1 *local_420;
  char *local_418;
  undefined1 *local_410;
  long local_408;
  ushort *local_400;
  char *local_3f8;
  string *local_3f0;
  char *local_3e8;
  ushort *local_3e0;
  undefined1 *local_3d8;
  long local_3d0;
  char *local_3c8;
  undefined1 *local_3c0;
  ushort *local_3b8;
  undefined1 *local_3b0;
  long local_3a8;
  ushort *local_3a0;
  undefined1 *local_398;
  ushort *local_390;
  char *local_388;
  string *local_380;
  char *local_378;
  undefined1 *local_370;
  long local_368;
  char *local_360;
  undefined1 *local_358;
  long local_350;
  ushort *local_348;
  char *local_340;
  string *local_338;
  undefined1 *local_330;
  long local_328;
  string *local_320;
  undefined1 *local_318;
  long local_310;
  string *local_308;
  undefined1 *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  ushort *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  long local_2d0;
  ushort *local_2c8;
  undefined1 *local_2c0;
  long local_2b8;
  ushort *local_2b0;
  undefined1 *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  long local_290;
  char *local_288;
  undefined1 *local_280;
  char *local_278;
  undefined4 local_26c;
  LogStringBuffer *local_268;
  undefined4 local_25c;
  LogStringBuffer *local_258;
  undefined1 local_240 [16];
  ostream aoStack_230 [376];
  char *local_b8;
  undefined4 local_ac;
  LogStringBuffer *local_a8;
  char *local_a0;
  string *local_98;
  undefined1 *local_90;
  LogStringBuffer *local_88;
  string *local_80;
  undefined1 *local_78;
  LogStringBuffer *local_70;
  string *local_68;
  undefined1 *local_60;
  char *local_58;
  undefined1 *local_50;
  LogStringBuffer *local_48;
  char *local_40;
  undefined1 *local_38;
  
  rendezvousServerConnectionId_00 = (uint32_t)((ulong)in_stack_fffffffffffff0e8 >> 0x20);
  key = (key_t)((ulong)in_stack_ffffffffffffed90 >> 0x20);
  local_ff0 = in_RDI + 0x3a58;
  local_1010 = in_RCX;
  bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_ffffffffffffed68);
  if (bVar1) {
    lVar2 = in_RDI + 8;
    local_fe8 = "P2P connection aborted during shutdown";
    local_f28 = "P2P connection aborted during shutdown";
    if (*(int *)(in_RDI + 0x10) < 4) {
      local_d5c = 3;
      local_d68 = "P2P connection aborted during shutdown";
      local_fe0 = lVar2;
      local_d58 = lVar2;
      logger::LogStringBuffer::LogStringBuffer
                ((LogStringBuffer *)CONCAT17(in_stack_ffffffffffffed67,in_stack_ffffffffffffed60),
                 (char *)in_stack_ffffffffffffed58,Trace);
      local_d48 = (string *)(in_RDI + 0x40);
      local_d50 = local_d68;
      local_d40 = local_ef0;
      local_d38 = lVar2;
      local_d30 = local_d48;
      local_d28 = local_ef0;
      local_d20 = lVar2;
      local_d18 = local_d48;
      local_d10 = local_ef0;
      std::operator<<(aoStack_ee0,local_d48);
      local_d00 = local_d40;
      local_d08 = local_d50;
      local_ce8 = local_d40;
      local_cf0 = local_d50;
      local_cf8 = lVar2;
      std::operator<<((ostream *)(local_d40 + 0x10),local_d50);
      logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(in_stack_ffffffffffffeda0,in_stack_ffffffffffffed98);
      logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1802fc);
    }
  }
  else {
    local_fc8 = local_1010;
    if ((*local_1010 & 1) == 0) {
      local_fbc = (undefined4)((ulong)*(undefined8 *)(local_1010 + 8) >> 0x20);
    }
    else {
      local_fbc = (undefined4)*(undefined8 *)(local_1010 + 8);
    }
    local_1018 = P2PConnectionKeyMap::FindByKey
                           ((P2PConnectionKeyMap *)in_stack_ffffffffffffed98,key);
    if (local_1018 == (IConnection *)0x0) {
      if ((*(byte *)(in_RDI + 0x3ab0) & 1) == 0) {
        initializeP2PSockets(in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
      }
      lVar2 = in_RDI + 8;
      asio::ip::basic_endpoint<asio::ip::udp>::address(in_stack_ffffffffffffed58);
      asio::ip::address::to_string_abi_cxx11_(in_stack_ffffffffffffed68);
      local_105a[0] =
           asio::ip::basic_endpoint<asio::ip::udp>::port((basic_endpoint<asio::ip::udp> *)0x1806b3);
      local_f80 = (ushort *)(local_1010 + 0x10);
      local_fd8 = local_1010;
      if ((*local_1010 & 1) == 0) {
        local_fcc = (undefined4)((ulong)*(undefined8 *)(local_1010 + 8) >> 0x20);
      }
      else {
        local_fcc = (undefined4)*(undefined8 *)(local_1010 + 8);
      }
      HexString_abi_cxx11_(in_stack_ffffffffffffedb8);
      local_f48 = "Server requesting that we P2P connect to ";
      local_f50 = local_1038;
      local_f58 = ":";
      local_f60 = local_105a;
      local_f68 = " - WinTies=";
      local_f70 = local_1010;
      local_f78 = " Interval=";
      local_f88 = ". Waiting for probe key = ";
      local_f90 = local_1090;
      local_f98 = ". Requesting ports from ";
      local_fa0 = local_1002;
      local_a34 = 2;
      local_a40 = "Server requesting that we P2P connect to ";
      local_a50 = ":";
      local_a60 = " - WinTies=";
      local_a68 = local_1010;
      local_a70 = " Interval=";
      local_a80 = ". Waiting for probe key = ";
      local_a90 = ". Requesting ports from ";
      local_a24 = 2;
      local_f40 = lVar2;
      local_a98 = local_fa0;
      local_a88 = local_f90;
      local_a78 = local_f80;
      local_a58 = local_f60;
      local_a48 = local_f50;
      local_a30 = lVar2;
      local_a20 = lVar2;
      if (*(int *)(in_RDI + 0x10) < 3) {
        local_81c = 2;
        local_828 = "Server requesting that we P2P connect to ";
        local_838 = ":";
        local_848 = " - WinTies=";
        local_850 = local_1010;
        local_858 = " Interval=";
        local_868 = ". Waiting for probe key = ";
        local_878 = ". Requesting ports from ";
        local_880 = local_fa0;
        local_870 = local_f90;
        local_860 = local_f80;
        local_840 = local_f60;
        local_830 = local_f50;
        local_818 = lVar2;
        logger::LogStringBuffer::LogStringBuffer
                  ((LogStringBuffer *)CONCAT17(in_stack_ffffffffffffed67,in_stack_ffffffffffffed60),
                   (char *)in_stack_ffffffffffffed58,Trace);
        local_7b0 = (string *)(in_RDI + 0x40);
        local_7a8 = local_a08;
        local_7b8 = local_828;
        local_7c0 = local_830;
        local_7c8 = local_838;
        local_7d0 = local_840;
        local_7d8 = local_848;
        local_7e0 = local_850;
        local_7e8 = local_858;
        local_7f0 = local_860;
        local_7f8 = local_868;
        local_800 = local_870;
        local_808 = local_878;
        local_810 = local_880;
        local_7a0 = lVar2;
        local_798 = local_7b0;
        local_790 = local_7a8;
        local_788 = lVar2;
        local_780 = local_7b0;
        local_778 = local_7a8;
        std::operator<<(aoStack_9f8,local_7b0);
        local_710 = local_7a8;
        local_718 = local_7b8;
        local_720 = local_7c0;
        local_728 = local_7c8;
        local_730 = local_7d0;
        local_738 = local_7d8;
        local_740 = local_7e0;
        local_748 = local_7e8;
        local_750 = local_7f0;
        local_758 = local_7f8;
        local_760 = local_800;
        local_768 = local_808;
        local_770 = local_810;
        local_6f8 = local_7a8;
        local_700 = local_7b8;
        local_650 = local_7a8;
        local_658 = local_7b8;
        local_708 = lVar2;
        local_6f0 = lVar2;
        std::operator<<((ostream *)(local_7a8 + 0x10),local_7b8);
        local_690 = local_710;
        local_698 = local_720;
        local_6a0 = local_728;
        local_6a8 = local_730;
        local_6b0 = local_738;
        local_6b8 = local_740;
        local_6c0 = local_748;
        local_6c8 = local_750;
        local_6d0 = local_758;
        local_6d8 = local_760;
        local_6e0 = local_768;
        local_6e8 = local_770;
        local_678 = local_710;
        local_680 = local_720;
        local_660 = local_710;
        local_668 = local_720;
        local_688 = lVar2;
        local_670 = lVar2;
        std::operator<<((ostream *)(local_710 + 0x10),local_720);
        local_5f8 = local_690;
        local_600 = local_6a0;
        local_608 = local_6a8;
        local_610 = local_6b0;
        local_618 = local_6b8;
        local_620 = local_6c0;
        local_628 = local_6c8;
        local_630 = local_6d0;
        local_638 = local_6d8;
        local_640 = local_6e0;
        local_648 = local_6e8;
        local_5e0 = local_690;
        local_5e8 = local_6a0;
        local_548 = local_690;
        local_550 = local_6a0;
        local_5f0 = lVar2;
        local_5d8 = lVar2;
        std::operator<<((ostream *)(local_690 + 0x10),local_6a0);
        local_588 = local_5f8;
        local_590 = local_608;
        local_598 = local_610;
        local_5a0 = local_618;
        local_5a8 = local_620;
        local_5b0 = local_628;
        local_5b8 = local_630;
        local_5c0 = local_638;
        local_5c8 = local_640;
        local_5d0 = local_648;
        local_570 = local_5f8;
        local_578 = local_608;
        local_558 = local_5f8;
        local_560 = local_608;
        local_580 = lVar2;
        local_568 = lVar2;
        std::ostream::operator<<((ostream *)(local_5f8 + 0x10),*local_608);
        local_500 = local_588;
        local_508 = local_598;
        local_510 = local_5a0;
        local_518 = local_5a8;
        local_520 = local_5b0;
        local_528 = local_5b8;
        local_530 = local_5c0;
        local_538 = local_5c8;
        local_540 = local_5d0;
        local_4e8 = local_588;
        local_4f0 = local_598;
        local_488 = local_588;
        local_490 = local_598;
        local_4f8 = lVar2;
        local_4e0 = lVar2;
        std::operator<<((ostream *)(local_588 + 0x10),local_598);
        local_4a0 = local_500;
        local_4a8 = local_510;
        local_4b0 = local_518;
        local_4b8 = local_520;
        local_4c0 = local_528;
        local_4c8 = local_530;
        local_4d0 = local_538;
        local_4d8 = local_540;
        local_478 = local_500;
        local_480 = local_510;
        local_420 = local_500;
        local_428 = local_510;
        pcVar4 = "false";
        if ((*local_510 & 1) != 0) {
          pcVar4 = "true";
        }
        local_498 = lVar2;
        local_470 = lVar2;
        std::operator<<((ostream *)(local_500 + 0x10),pcVar4);
        local_438 = local_4a0;
        local_440 = local_4b0;
        local_448 = local_4b8;
        local_450 = local_4c0;
        local_458 = local_4c8;
        local_460 = local_4d0;
        local_468 = local_4d8;
        local_410 = local_4a0;
        local_418 = local_4b0;
        local_3c0 = local_4a0;
        local_3c8 = local_4b0;
        local_430 = lVar2;
        local_408 = lVar2;
        std::operator<<((ostream *)(local_4a0 + 0x10),local_4b0);
        local_3d8 = local_438;
        local_3e0 = local_448;
        local_3e8 = local_450;
        local_3f0 = local_458;
        local_3f8 = local_460;
        local_400 = local_468;
        local_3b0 = local_438;
        local_3b8 = local_448;
        local_398 = local_438;
        local_3a0 = local_448;
        local_3d0 = lVar2;
        local_3a8 = lVar2;
        std::ostream::operator<<((ostream *)(local_438 + 0x10),*local_448);
        local_370 = local_3d8;
        local_378 = local_3e8;
        local_380 = local_3f0;
        local_388 = local_3f8;
        local_390 = local_400;
        local_358 = local_3d8;
        local_360 = local_3e8;
        local_2f0 = local_3d8;
        local_2f8 = local_3e8;
        local_368 = lVar2;
        local_350 = lVar2;
        std::operator<<((ostream *)(local_3d8 + 0x10),local_3e8);
        local_330 = local_370;
        local_338 = local_380;
        local_340 = local_388;
        local_348 = local_390;
        local_318 = local_370;
        local_320 = local_380;
        local_300 = local_370;
        local_308 = local_380;
        local_328 = lVar2;
        local_310 = lVar2;
        std::operator<<((ostream *)(local_370 + 0x10),local_380);
        local_2d8 = local_330;
        local_2e0 = local_340;
        local_2e8 = local_348;
        local_298 = local_330;
        local_2a0 = local_340;
        local_280 = local_330;
        local_288 = local_340;
        local_2d0 = lVar2;
        local_290 = lVar2;
        std::operator<<((ostream *)(local_330 + 0x10),local_340);
        local_2c0 = local_2d8;
        local_2c8 = local_2e8;
        local_2a8 = local_2d8;
        local_2b0 = local_2e8;
        local_2b8 = lVar2;
        std::ostream::operator<<((ostream *)(local_2d8 + 0x10),*local_2e8);
        logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(in_stack_ffffffffffffeda0,in_stack_ffffffffffffed98);
        logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1817f7);
      }
      std::__cxx11::string::~string(local_1090);
      std::__cxx11::string::~string(local_1038);
      this_00 = (OutputWorker *)operator_new(0xc930,(nothrow_t *)&std::nothrow);
      local_10a1 = 0;
      local_1098 = (OutputWorker *)0x0;
      if (this_00 != (OutputWorker *)0x0) {
        local_10a1 = 1;
        local_10a0 = this_00;
        Connection::Connection((Connection *)0x0);
        local_1098 = this_00;
      }
      if (local_1098 == (OutputWorker *)0x0) {
        pLVar3 = (LogStringBuffer *)(in_RDI + 8);
        local_f38 = "OOM during new P2P connection";
        local_26c = 4;
        local_278 = "OOM during new P2P connection";
        local_25c = 4;
        if (*(int *)(in_RDI + 0x10) < 5) {
          local_ac = 4;
          local_b8 = "OOM during new P2P connection";
          buffer_00 = pLVar3;
          local_f30 = pLVar3;
          local_268 = pLVar3;
          local_258 = pLVar3;
          local_a8 = pLVar3;
          logger::LogStringBuffer::LogStringBuffer
                    ((LogStringBuffer *)
                     CONCAT17(in_stack_ffffffffffffed67,in_stack_ffffffffffffed60),
                     (char *)in_stack_ffffffffffffed58,Trace);
          local_98 = (string *)(in_RDI + 0x40);
          local_a0 = local_b8;
          local_90 = local_240;
          local_88 = pLVar3;
          local_80 = local_98;
          local_78 = local_240;
          local_70 = pLVar3;
          local_68 = local_98;
          local_60 = local_240;
          std::operator<<(aoStack_230,local_98);
          local_50 = local_90;
          local_58 = local_a0;
          local_38 = local_90;
          local_40 = local_a0;
          local_48 = pLVar3;
          std::operator<<((ostream *)(local_90 + 0x10),local_a0);
          logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(this_00,buffer_00);
          logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x181ae0);
        }
      }
      else {
        std::__shared_ptr<tonk::gateway::MappedPortLifetime,_(__gnu_cxx::_Lock_policy)2>::get
                  ((__shared_ptr<tonk::gateway::MappedPortLifetime,_(__gnu_cxx::_Lock_policy)2> *)
                   (in_RDI + 0x3ab8));
        std::shared_ptr<asio::io_context>::shared_ptr
                  ((shared_ptr<asio::io_context> *)
                   CONCAT17(in_stack_ffffffffffffed67,in_stack_ffffffffffffed60),
                   (shared_ptr<asio::io_context> *)in_stack_ffffffffffffed58);
        asio::ip::basic_endpoint<asio::ip::udp>::basic_endpoint
                  ((basic_endpoint<asio::ip::udp> *)0x181c30);
        Connection::InitializeP2PConnection
                  (in_stack_fffffffffffff100,in_stack_fffffffffffff0f8,
                   (TonkSocketConfig *)CONCAT44(in_stack_fffffffffffff0f4,in_stack_fffffffffffff0f0)
                   ,rendezvousServerConnectionId_00,
                   (P2PConnectParams *)CONCAT44(in_stack_fffffffffffff0e4,in_stack_fffffffffffff0e0)
                  );
        Connection::Dependencies::~Dependencies((Dependencies *)0x181c82);
        local_ff8 = &local_10b0;
        uVar5 = local_10b0 != 0;
        if ((bool)uVar5) {
          if (local_1098 != (OutputWorker *)0x0) {
            (**(code **)((local_1098->StartStopLock).super___mutex_base._M_mutex.__align + 8))();
          }
          local_1098 = (OutputWorker *)0x0;
        }
        Result::~Result((Result *)CONCAT17(uVar5,in_stack_ffffffffffffed60));
      }
    }
    else {
      lVar2 = in_RDI + 8;
      local_fb8 = "Ignoring simultaneous P2P connect request with the same incoming probe key";
      local_cd4 = 3;
      local_ce0 = "Ignoring simultaneous P2P connect request with the same incoming probe key";
      local_cc4 = 3;
      local_fb0 = lVar2;
      local_cd0 = lVar2;
      local_cc0 = lVar2;
      if (*(int *)(in_RDI + 0x10) < 4) {
        local_b14 = 3;
        local_b20 = "Ignoring simultaneous P2P connect request with the same incoming probe key";
        local_b10 = lVar2;
        logger::LogStringBuffer::LogStringBuffer
                  ((LogStringBuffer *)CONCAT17(in_stack_ffffffffffffed67,in_stack_ffffffffffffed60),
                   (char *)in_stack_ffffffffffffed58,Trace);
        local_b00 = (string *)(in_RDI + 0x40);
        local_b08 = local_b20;
        local_af8 = local_ca8;
        local_af0 = lVar2;
        local_ae8 = local_b00;
        local_ae0 = local_ca8;
        local_ad8 = lVar2;
        local_ad0 = local_b00;
        local_ac8 = local_ca8;
        std::operator<<(aoStack_c98,local_b00);
        local_ab8 = local_af8;
        local_ac0 = local_b08;
        local_aa0 = local_af8;
        local_aa8 = local_b08;
        local_ab0 = lVar2;
        std::operator<<((ostream *)(local_af8 + 0x10),local_b08);
        logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(in_stack_ffffffffffffeda0,in_stack_ffffffffffffed98);
        logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x180608);
      }
      local_fa8 = &local_1018->SelfRefCount;
      std::__atomic_base<int>::operator--
                (&(local_1018->SelfRefCount).RefCount.super___atomic_base<int>);
    }
  }
  return;
}

Assistant:

void ApplicationSession::onP2PStartConnect(
    uint16_t myRendezvousVisibleSourcePort,
    uint32_t rendezvousServerConnectionId,
    const protocol::P2PConnectParams& startParams)
{
    if (SelfRefCount.IsShutdown())
    {
        Logger.Warning("P2P connection aborted during shutdown");
        return;
    }

    // Attempt to find a duplicate connection request
    IConnection* icon = P2PKeyMap.FindByKey(startParams.GetExpectedIncomingProbeKey());
    if (icon)
    {
        Logger.Warning("Ignoring simultaneous P2P connect request with the same incoming probe key");
        icon->SelfRefCount.DecrementReferences();
        return;
    }

    // Note that this function is called from the Asio green thread,
    // so the P2P sockets will only be initialized once
    if (!P2PSocketsInitialized) {
        initializeP2PSockets(startParams);
    }

    Logger.Info("Server requesting that we P2P connect to ",
        startParams.PeerExternalAddress.address().to_string(), ":", startParams.PeerExternalAddress.port(),
        " - WinTies=", startParams.WinTies, " Interval=",
        startParams.ProtocolRoundIntervalMsec, ". Waiting for probe key = ",
        HexString(startParams.GetExpectedIncomingProbeKey()),
        ". Requesting ports from ", myRendezvousVisibleSourcePort);

    Connection* connection = new(std::nothrow) Connection;

    if (!connection)
    {
        Logger.Error("OOM during new P2P connection");
        return;
    }

    Result result = connection->InitializeP2PConnection({
        &SelfRefCount,
        &MainSocket,
        &MainSocket.AddressMap,
        &IdMap,
        &P2PKeyMap,
        MappedPort.get(),
        Context,
        nullptr, // No FloodDetector backref for P2P connections
        UDPAddress(), // No Disconnect addr key
        this
    },
        &Config,
        rendezvousServerConnectionId,
        startParams);

    if (result.IsFail())
    {
        // Result already logged in InitializeP2PConnection()
        delete connection;
        connection = nullptr;
    }
}